

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::SerializeWithCachedSizes
          (RandomNormalStaticLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  int64 iVar2;
  uint64 value;
  float fVar3;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  RandomNormalStaticLayerParams *this_local;
  
  iVar2 = seed(this);
  if (iVar2 != 0) {
    iVar2 = seed(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  fVar3 = mean(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = mean(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar3,output);
  }
  fVar3 = stddev(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = stddev(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar3,output);
  }
  iVar1 = outputshape_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(4,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
  }
  local_20 = 0;
  iVar1 = outputshape_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    value = outputshape(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  return;
}

Assistant:

void RandomNormalStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomNormalStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float mean = 2;
  if (this->mean() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->mean(), output);
  }

  // float stdDev = 3;
  if (this->stddev() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->stddev(), output);
  }

  // repeated uint64 outputShape = 4;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomNormalStaticLayerParams)
}